

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitExpressionStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,ExpressionStmt *stmt)

{
  type expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ExpressionStmt *local_20;
  ExpressionStmt *stmt_local;
  AstSerialise *this_local;
  
  local_20 = stmt;
  stmt_local = (ExpressionStmt *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  std::operator+(&local_60,&this->m_ident,"(Stmt::Expression ");
  expr = std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator*(&local_20->expr)
  ;
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_80,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,expr);
  std::operator+(&local_40,&local_60,&local_80);
  std::operator+(__return_storage_ptr__,&local_40,")");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitExpressionStmt(ExpressionStmt &stmt) {
        return m_ident + "(Stmt::Expression " + visitExpr(*stmt.expr) + ")";
    }